

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q.cpp
# Opt level: O0

void __thiscall Q::cleanup(Q *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  time_t tVar2;
  time_t tVar3;
  undefined1 local_e0 [8];
  File item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  time_t one_month_ago;
  Datetime now;
  int count;
  Q *this_local;
  
  now._date._4_4_ = 0;
  Datetime::Datetime((Datetime *)&one_month_ago);
  Datetime::operator-=((Datetime *)&one_month_ago,0x278d00);
  tVar2 = Datetime::toEpoch((Datetime *)&one_month_ago);
  archive_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__begin1,this);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin1);
  entry = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&entry);
    if (!bVar1) break;
    item._80_8_ = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
    File::File((File *)local_e0,(string *)item._80_8_);
    tVar3 = File::mtime((File *)local_e0);
    if (tVar3 < tVar2) {
      now._date._4_4_ = now._date._4_4_ + 1;
    }
    File::~File((File *)local_e0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin1);
  return;
}

Assistant:

int Q::cleanup () const
{
  // Count the removals.
  int count = 0;

  // Calculate epoch 30 days ago.
  Datetime now;
  now -= 30 * 86400;
  auto one_month_ago = now.toEpoch ();

  for (const auto& entry : archive ())
  {
    File item (entry);
    if (item.mtime () < one_month_ago)
    {
      //item.remove ();
      ++count;
    }
  }

  return count;
}